

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O3

void skewness_double_suite::test_linear_increase(void)

{
  double dVar1;
  anon_struct_8_1_6167ffdf_for_sum aVar2;
  double dVar3;
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  close_to<double> predicate_09;
  close_to<double> predicate_10;
  close_to<double> predicate_11;
  close_to<double> predicate_12;
  close_to<double> predicate_13;
  close_to<double> predicate_14;
  close_to<double> predicate_15;
  close_to<double> predicate_16;
  close_to<double> predicate_17;
  close_to<double> predicate_18;
  close_to<double> predicate_19;
  close_to<double> predicate_20;
  close_to<double> predicate_21;
  close_to<double> predicate_22;
  close_to<double> predicate_23;
  close_to<double> predicate_24;
  close_to<double> predicate_25;
  close_to<double> predicate_26;
  double *in_stack_ffffffffffffff58;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  undefined8 uStack_80;
  moment_skewness<double> filter;
  
  filter.super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.mean_factor = 0.125;
  filter.super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.normalization = 0.0;
  filter.super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.sum.mean = 0.0;
  filter.super_basic_moment<double,_(trial::online::with)2>.var_factor = 0.25;
  filter.super_basic_moment<double,_(trial::online::with)2>.normalization = 0.0;
  filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance = 0.0;
  filter.skewness_factor = 0.25;
  filter.normalization = 0.0;
  filter.sum.skewness = 0.0;
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push(&filter,1.0);
  local_a0 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_98 = 1.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x208,"void skewness_double_suite::test_linear_increase()",&local_a0,&local_98);
  local_a0 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                            / filter.super_basic_moment<double,_(trial::online::with)2>.
                              normalization));
  local_98 = 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x209,"void skewness_double_suite::test_linear_increase()",&local_a0,&local_98);
  dVar1 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                             / filter.super_basic_moment<double,_(trial::online::with)2>.
                               normalization)), 2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_90 = filter.sum.skewness;
      uStack_80 = 0;
      local_88 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_90;
      dVar3 = local_88;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) / filter.normalization;
  }
  local_98 = 0.0;
  predicate.absolute = 2.2250738585072014e-308;
  predicate.relative = 1e-05;
  local_a0 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x20a,0x10e7d5,(char *)&local_a0,&local_98,in_stack_ffffffffffffff58,predicate
            );
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push(&filter,2.0);
  local_a0 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_98 = 1.53333;
  predicate_00.absolute = 2.2250738585072014e-308;
  predicate_00.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x20c,0x10e7d5,(char *)&local_a0,&local_98,in_stack_ffffffffffffff58,
             predicate_00);
  local_a0 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                            / filter.super_basic_moment<double,_(trial::online::with)2>.
                              normalization));
  local_98 = 0.124444;
  predicate_01.absolute = 2.2250738585072014e-308;
  predicate_01.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.124444","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x20d,0x10e7d5,(char *)&local_a0,&local_98,in_stack_ffffffffffffff58,
             predicate_01);
  dVar1 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                             / filter.super_basic_moment<double,_(trial::online::with)2>.
                               normalization)), 2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_90 = filter.sum.skewness;
      uStack_80 = 0;
      local_88 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_90;
      dVar3 = local_88;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) / filter.normalization;
  }
  local_98 = 1.32288;
  predicate_02.absolute = 2.2250738585072014e-308;
  predicate_02.relative = 1e-05;
  local_a0 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.32288","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x20e,0x10e7d5,(char *)&local_a0,&local_98,in_stack_ffffffffffffff58,
             predicate_02);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push(&filter,3.0);
  local_a0 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_98 = 2.08876;
  predicate_03.absolute = 2.2250738585072014e-308;
  predicate_03.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2.08876","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x210,0x10e7d5,(char *)&local_a0,&local_98,in_stack_ffffffffffffff58,
             predicate_03);
  local_a0 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                            / filter.super_basic_moment<double,_(trial::online::with)2>.
                              normalization));
  local_98 = 0.429707;
  predicate_04.absolute = 2.2250738585072014e-308;
  predicate_04.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.429707","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x211,0x10e7d5,(char *)&local_a0,&local_98,in_stack_ffffffffffffff58,
             predicate_04);
  dVar1 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                             / filter.super_basic_moment<double,_(trial::online::with)2>.
                               normalization)), 2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_90 = filter.sum.skewness;
      uStack_80 = 0;
      local_88 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_90;
      dVar3 = local_88;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) / filter.normalization;
  }
  local_98 = 1.27863;
  predicate_05.absolute = 2.2250738585072014e-308;
  predicate_05.relative = 1e-05;
  local_a0 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.27863","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x212,0x10e7d5,(char *)&local_a0,&local_98,in_stack_ffffffffffffff58,
             predicate_05);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push(&filter,4.0);
  local_a0 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_98 = 2.66608;
  predicate_06.absolute = 2.2250738585072014e-308;
  predicate_06.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2.66608","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x214,0x10e7d5,(char *)&local_a0,&local_98,in_stack_ffffffffffffff58,
             predicate_06);
  local_a0 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                            / filter.super_basic_moment<double,_(trial::online::with)2>.
                              normalization));
  local_98 = 0.923291;
  predicate_07.absolute = 2.2250738585072014e-308;
  predicate_07.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.923291","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x215,0x10e7d5,(char *)&local_a0,&local_98,in_stack_ffffffffffffff58,
             predicate_07);
  dVar1 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                             / filter.super_basic_moment<double,_(trial::online::with)2>.
                               normalization)), 2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_90 = filter.sum.skewness;
      uStack_80 = 0;
      local_88 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_90;
      dVar3 = local_88;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) / filter.normalization;
  }
  local_98 = 1.23592;
  predicate_08.absolute = 2.2250738585072014e-308;
  predicate_08.relative = 1e-05;
  local_a0 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.23592","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x216,0x10e7d5,(char *)&local_a0,&local_98,in_stack_ffffffffffffff58,
             predicate_08);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push(&filter,5.0);
  local_a0 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_98 = 3.26502;
  predicate_09.absolute = 2.2250738585072014e-308;
  predicate_09.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","3.26502","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x218,0x10e7d5,(char *)&local_a0,&local_98,in_stack_ffffffffffffff58,
             predicate_09);
  local_a0 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                            / filter.super_basic_moment<double,_(trial::online::with)2>.
                              normalization));
  local_98 = 1.60733;
  predicate_10.absolute = 2.2250738585072014e-308;
  predicate_10.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.60733","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x219,0x10e7d5,(char *)&local_a0,&local_98,in_stack_ffffffffffffff58,
             predicate_10);
  dVar1 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                             / filter.super_basic_moment<double,_(trial::online::with)2>.
                               normalization)), 2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_90 = filter.sum.skewness;
      uStack_80 = 0;
      local_88 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_90;
      dVar3 = local_88;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) / filter.normalization;
  }
  local_98 = 1.20177;
  predicate_11.absolute = 2.2250738585072014e-308;
  predicate_11.relative = 1e-05;
  local_a0 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.20177","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x21a,0x10e7d5,(char *)&local_a0,&local_98,in_stack_ffffffffffffff58,
             predicate_11);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push(&filter,6.0);
  local_a0 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_98 = 3.88525;
  predicate_12.absolute = 2.2250738585072014e-308;
  predicate_12.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","3.88525","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x21c,0x10e7d5,(char *)&local_a0,&local_98,in_stack_ffffffffffffff58,
             predicate_12);
  local_a0 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                            / filter.super_basic_moment<double,_(trial::online::with)2>.
                              normalization));
  local_98 = 2.47861;
  predicate_13.absolute = 2.2250738585072014e-308;
  predicate_13.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","2.47861","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x21d,0x10e7d5,(char *)&local_a0,&local_98,in_stack_ffffffffffffff58,
             predicate_13);
  dVar1 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                             / filter.super_basic_moment<double,_(trial::online::with)2>.
                               normalization)), 2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_90 = filter.sum.skewness;
      uStack_80 = 0;
      local_88 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_90;
      dVar3 = local_88;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) / filter.normalization;
  }
  local_98 = 1.1738;
  predicate_14.absolute = 2.2250738585072014e-308;
  predicate_14.relative = 1e-05;
  local_a0 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.1738","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x21e,0x10e7d5,(char *)&local_a0,&local_98,in_stack_ffffffffffffff58,
             predicate_14);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push(&filter,7.0);
  local_a0 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_98 = 4.52635;
  predicate_15.absolute = 2.2250738585072014e-308;
  predicate_15.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","4.52635","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x220,0x10e7d5,(char *)&local_a0,&local_98,in_stack_ffffffffffffff58,
             predicate_15);
  local_a0 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                            / filter.super_basic_moment<double,_(trial::online::with)2>.
                              normalization));
  local_98 = 3.52889;
  predicate_16.absolute = 2.2250738585072014e-308;
  predicate_16.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","3.52889","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x221,0x10e7d5,(char *)&local_a0,&local_98,in_stack_ffffffffffffff58,
             predicate_16);
  dVar1 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                             / filter.super_basic_moment<double,_(trial::online::with)2>.
                               normalization)), 2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_90 = filter.sum.skewness;
      uStack_80 = 0;
      local_88 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_90;
      dVar3 = local_88;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) / filter.normalization;
  }
  local_98 = 1.15036;
  predicate_17.absolute = 2.2250738585072014e-308;
  predicate_17.relative = 1e-05;
  local_a0 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.15036","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x222,0x10e7d5,(char *)&local_a0,&local_98,in_stack_ffffffffffffff58,
             predicate_17);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push(&filter,8.0);
  local_a0 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_98 = 5.18786;
  predicate_18.absolute = 2.2250738585072014e-308;
  predicate_18.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.18786","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x224,0x10e7d5,(char *)&local_a0,&local_98,in_stack_ffffffffffffff58,
             predicate_18);
  local_a0 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                            / filter.super_basic_moment<double,_(trial::online::with)2>.
                              normalization));
  local_98 = 4.7455;
  predicate_19.absolute = 2.2250738585072014e-308;
  predicate_19.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","4.7455","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x225,0x10e7d5,(char *)&local_a0,&local_98,in_stack_ffffffffffffff58,
             predicate_19);
  dVar1 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                             / filter.super_basic_moment<double,_(trial::online::with)2>.
                               normalization)), 2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_90 = filter.sum.skewness;
      uStack_80 = 0;
      local_88 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_90;
      dVar3 = local_88;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) / filter.normalization;
  }
  local_98 = 1.13038;
  predicate_20.absolute = 2.2250738585072014e-308;
  predicate_20.relative = 1e-05;
  local_a0 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.13038","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x226,0x10e7d5,(char *)&local_a0,&local_98,in_stack_ffffffffffffff58,
             predicate_20);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push(&filter,9.0);
  local_a0 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_98 = 5.86924;
  predicate_21.absolute = 2.2250738585072014e-308;
  predicate_21.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.86924","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x228,0x10e7d5,(char *)&local_a0,&local_98,in_stack_ffffffffffffff58,
             predicate_21);
  local_a0 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                            / filter.super_basic_moment<double,_(trial::online::with)2>.
                              normalization));
  local_98 = 6.11216;
  predicate_22.absolute = 2.2250738585072014e-308;
  predicate_22.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","6.11216","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x229,0x10e7d5,(char *)&local_a0,&local_98,in_stack_ffffffffffffff58,
             predicate_22);
  dVar1 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                             / filter.super_basic_moment<double,_(trial::online::with)2>.
                               normalization)), 2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_90 = filter.sum.skewness;
      uStack_80 = 0;
      local_88 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_90;
      dVar3 = local_88;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) / filter.normalization;
  }
  local_98 = 1.1132;
  predicate_23.absolute = 2.2250738585072014e-308;
  predicate_23.relative = 1e-05;
  local_a0 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.1132","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x22a,0x10e7d5,(char *)&local_a0,&local_98,in_stack_ffffffffffffff58,
             predicate_23);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push(&filter,10.0);
  local_a0 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_98 = 6.56991;
  predicate_24.absolute = 2.2250738585072014e-308;
  predicate_24.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","6.56991","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x22c,0x10e7d5,(char *)&local_a0,&local_98,in_stack_ffffffffffffff58,
             predicate_24);
  local_a0 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                            / filter.super_basic_moment<double,_(trial::online::with)2>.
                              normalization));
  local_98 = 7.60984;
  predicate_25.absolute = 2.2250738585072014e-308;
  predicate_25.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","7.60984","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x22d,0x10e7d5,(char *)&local_a0,&local_98,in_stack_ffffffffffffff58,
             predicate_25);
  dVar1 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                             / filter.super_basic_moment<double,_(trial::online::with)2>.
                               normalization)), 2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_90 = filter.sum.skewness;
      uStack_80 = 0;
      local_88 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_90;
      dVar3 = local_88;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) / filter.normalization;
  }
  local_98 = 1.09832;
  predicate_26.absolute = 2.2250738585072014e-308;
  predicate_26.relative = 1e-05;
  local_a0 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.09832","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x22e,0x10e7d5,(char *)&local_a0,&local_98,in_stack_ffffffffffffff58,
             predicate_26);
  return;
}

Assistant:

void test_linear_increase()
{
    // Results are inherently skewed because of the weights of exponential smoothing

    const auto tolerance = detail::close_to<double>(1e-5);
    decay::moment_skewness<double> filter(one_over_eight, one_over_four, one_over_four);

    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_WITH(filter.skewness(), 0.0, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.53333, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.124444, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.32288, tolerance);
    filter.push(3.0);
    TRIAL_TEST_WITH(filter.mean(), 2.08876, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.429707, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.27863, tolerance);
    filter.push(4.0);
    TRIAL_TEST_WITH(filter.mean(), 2.66608, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.923291, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.23592, tolerance);
    filter.push(5.0);
    TRIAL_TEST_WITH(filter.mean(), 3.26502, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.60733, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.20177, tolerance);
    filter.push(6.0);
    TRIAL_TEST_WITH(filter.mean(), 3.88525, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 2.47861, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.1738, tolerance);
    filter.push(7.0);
    TRIAL_TEST_WITH(filter.mean(), 4.52635, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 3.52889, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.15036, tolerance);
    filter.push(8.0);
    TRIAL_TEST_WITH(filter.mean(), 5.18786, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 4.7455, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.13038, tolerance);
    filter.push(9.0);
    TRIAL_TEST_WITH(filter.mean(), 5.86924, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 6.11216, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.1132, tolerance);
    filter.push(10.0);
    TRIAL_TEST_WITH(filter.mean(), 6.56991, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 7.60984, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.09832, tolerance);
}